

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

int serverAtomicRead(void *fd,void *buffer,int length)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  int junk_errno;
  char *junk_result_str;
  uint local_1c;
  char *local_18;
  
  local_18 = (char *)0x0;
  uVar1 = (*ffs_server_read_func)(fd,buffer,(long)length,(int *)&local_1c,&local_18);
  pcVar3 = getenv("BAD_CLIENT");
  if (pcVar3 != (char *)0x0) {
    dVar4 = drand48();
    if (dVar4 < 0.0001) {
      sleep(600);
    }
  }
  if (uVar1 != length) {
    iVar2 = get_format_server_verbose();
    if (iVar2 != 0) {
      printf("server read error, return is %d, length %d, errno %d\n",(ulong)uVar1,
             (ulong)(uint)length,(ulong)local_1c);
      if (local_18 != (char *)0x0) {
        printf("result_string is %s\n");
      }
    }
  }
  return uVar1;
}

Assistant:

extern int
serverAtomicRead(void *fd, void *buffer, int length)
{
    char *junk_result_str = NULL;
    int junk_errno;
    int ret = ffs_server_read_func(fd, buffer, length, &junk_errno,
				  &junk_result_str);

    if (getenv("BAD_CLIENT") && (drand48() < 0.0001)) sleep(600);
    if (ret != length) {
	if (get_format_server_verbose()) {
	    printf("server read error, return is %d, length %d, errno %d\n",
		   ret, length, junk_errno);
	    if (junk_result_str != NULL) {
		printf("result_string is %s\n", junk_result_str);
	    }
	}
    }
    return ret;
}